

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::ChMatterMeshless(ChMatterMeshless *this,ChMatterMeshless *other)

{
  int newsize;
  
  ChIndexedNodes::ChIndexedNodes(&this->super_ChIndexedNodes,&other->super_ChIndexedNodes);
  (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChMatterMeshless_01173518;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->matsurface).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->material).
  super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                 )SUB3224(ZEXT432(0) << 0x40,0);
  (this->material).
  super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)SUB328(ZEXT432(0) << 0x40,0x18);
  this->do_collide = other->do_collide;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,
             &(other->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  newsize = (*(other->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                      (other);
  ResizeNnodes(this,newsize);
  return;
}

Assistant:

ChMatterMeshless::ChMatterMeshless(const ChMatterMeshless& other) : ChIndexedNodes(other) {
    do_collide = other.do_collide;

    matsurface = other.matsurface;

    ResizeNnodes(other.GetNnodes());
}